

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  undefined1 auVar1 [16];
  ImVec2 IVar2;
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ImGuiContext *pIVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar24;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar36 [64];
  float fVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  pIVar10 = GImGui;
  auVar36._8_56_ = in_register_00001248;
  auVar36._0_8_ = v_max;
  auVar29._8_56_ = in_register_00001208;
  auVar29._0_8_ = v_min;
  auVar22 = auVar36._0_16_;
  auVar25 = auVar29._0_16_;
  uVar13 = (ulong)(flags & 1);
  uVar12 = data_type & 0xfffffffe;
  bVar14 = uVar12 == 8;
  bVar16 = power != 1.0;
  fVar37 = (&(bb->Min).x)[uVar13];
  fVar23 = (&(bb->Max).x)[uVar13];
  fVar3 = (fVar23 - fVar37) + -4.0;
  fVar42 = (GImGui->Style).GrabMinSize;
  auVar19 = ZEXT416((uint)fVar42);
  dVar39 = v_max - v_min;
  uVar4 = vcmpsd_avx512f(auVar25,auVar22,1);
  bVar15 = (bool)((byte)uVar4 & 1);
  dVar18 = (double)((ulong)bVar15 * (long)dVar39 + (ulong)!bVar15 * (long)(v_min - v_max));
  if ((uVar12 != 8) && (0.0 <= dVar18)) {
    dVar38 = (double)fVar3 / (dVar18 + 1.0);
    auVar19._0_4_ = (float)dVar38;
    auVar19._4_4_ = (int)((ulong)dVar38 >> 0x20);
    auVar19._8_8_ = 0;
    uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar42),auVar19,2);
    bVar15 = (bool)((byte)uVar4 & 1);
    auVar19 = ZEXT416((uint)bVar15 * (int)auVar19._0_4_ + (uint)!bVar15 * (int)fVar42);
  }
  auVar19 = vminss_avx(auVar19,ZEXT416((uint)fVar3));
  if ((!bVar16 || !bVar14) || 0.0 <= v_min * v_max) {
    fVar42 = (float)((uint)(v_min < 0.0) * 0x3f800000);
  }
  else {
    auVar20._0_8_ = -v_min;
    auVar20._8_8_ = in_register_00001208._0_8_ ^ 0x8000000000000000;
    uVar4 = vcmpsd_avx512f(auVar20,auVar25,2);
    bVar15 = (bool)((byte)uVar4 & 1);
    dVar38 = pow((double)((ulong)bVar15 * (long)v_min + (ulong)!bVar15 * (long)auVar20._0_8_),
                 1.0 / (double)power);
    auVar26._0_8_ = -v_max;
    auVar26._8_8_ = in_register_00001248._0_8_ ^ 0x8000000000000000;
    uVar4 = vcmpsd_avx512f(auVar26,auVar22,2);
    bVar15 = (bool)((byte)uVar4 & 1);
    dVar24 = pow((double)((ulong)bVar15 * (long)v_max + (ulong)!bVar15 * (long)auVar26._0_8_),
                 1.0 / (double)power);
    fVar42 = (float)(dVar38 / (dVar38 + dVar24));
  }
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar37 + 2.0)),auVar19,SUB6416(ZEXT464(0x3f000000),0));
  fVar37 = auVar20._0_4_;
  if (pIVar10->ActiveId == id) {
    if (pIVar10->ActiveIdSource == ImGuiInputSource_Nav) {
      auVar30._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      auVar30._8_56_ = extraout_var_02;
      if ((pIVar10->NavActivatePressedId == id) && (pIVar10->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
        bVar15 = false;
        auVar27 = SUB6416(ZEXT864(0),0) << 0x40;
      }
      else {
        auVar20 = vmovshdup_avx(auVar30._0_16_);
        auVar7._8_4_ = 0x80000000;
        auVar7._0_8_ = 0x8000000080000000;
        auVar7._12_4_ = 0x80000000;
        auVar20 = vxorps_avx512vl(auVar20,auVar7);
        fVar17 = (float)((uint)(uVar13 == 0) * (int)auVar30._0_4_ +
                        (uint)(uVar13 != 0) * auVar20._0_4_);
        auVar27 = ZEXT816(0) << 0x40;
        if ((fVar17 != 0.0) || (NAN(fVar17))) {
          auVar31._0_4_ =
               SliderCalcRatioFromValueT<double,double>(data_type,*v,v_min,v_max,power,fVar42);
          auVar31._4_60_ = extraout_var;
          auVar27 = auVar31._0_16_;
          if ((uVar12 != 8) ||
             (iVar11 = ImParseFormatPrecision(format,3), (bool)(~(bVar16 && bVar14) & iVar11 < 1)))
          {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = dVar18;
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0x7fffffffffffffff;
            auVar8._12_4_ = 0x7fffffff;
            auVar20 = vandpd_avx512vl(auVar9,auVar8);
            if ((auVar20._0_8_ <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
              uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar17),0xe);
              bVar15 = (bool)((byte)uVar4 & 1);
              fVar17 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * 0x3f800000) /
                       (float)dVar18;
            }
            else {
              fVar17 = fVar17 / 100.0;
            }
          }
          else {
            uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
            bVar15 = (bool)((byte)uVar4 & 1);
            fVar17 = (float)((uint)bVar15 * (int)((fVar17 / 100.0) / 10.0) +
                            (uint)!bVar15 * (int)(fVar17 / 100.0));
          }
          uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
          bVar15 = (bool)((byte)uVar4 & 1);
          fVar17 = (float)((uint)bVar15 * (int)(fVar17 * 10.0) + (uint)!bVar15 * (int)fVar17);
          if (((1.0 <= auVar31._0_4_) && (0.0 < fVar17)) ||
             ((auVar31._0_4_ <= 0.0 && (fVar17 < 0.0)))) {
            bVar15 = false;
          }
          else {
            auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                 ZEXT416((uint)(auVar31._0_4_ + fVar17)));
            uVar4 = vcmpss_avx512f(ZEXT416((uint)(auVar31._0_4_ + fVar17)),ZEXT816(0),1);
            auVar27._4_12_ = auVar20._4_12_;
            auVar27._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar20._0_4_;
            bVar15 = true;
          }
        }
        else {
          bVar15 = false;
        }
      }
    }
    else {
      auVar27 = SUB6416(ZEXT864(0),0) << 0x40;
      if (pIVar10->ActiveIdSource == ImGuiInputSource_Mouse) {
        if ((pIVar10->IO).MouseDown[0] == false) {
          ClearActiveID();
          auVar27 = ZEXT816(0) << 0x40;
          bVar15 = false;
        }
        else {
          fVar17 = fVar3 - auVar19._0_4_;
          fVar43 = 0.0;
          if (0.0 < fVar17) {
            auVar26 = ZEXT416((uint)((*(float *)((pIVar10->IO).MouseDown + uVar13 * 4 + -8) - fVar37
                                     ) / fVar17));
            auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar26);
            uVar4 = vcmpss_avx512f(auVar26,ZEXT816(0) << 0x20,1);
            fVar43 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar20._0_4_);
          }
          auVar27 = ZEXT416((uint)(uVar13 == 0) * (int)fVar43 +
                            (uint)(uVar13 != 0) * (int)(1.0 - fVar43));
          bVar15 = true;
        }
      }
      else {
        bVar15 = false;
      }
    }
    if (bVar15) {
      fVar17 = auVar27._0_4_;
      if (bVar16 && bVar14) {
        if (fVar42 <= fVar17) {
          auVar6._8_4_ = 0x7fffffff;
          auVar6._0_8_ = 0x7fffffff7fffffff;
          auVar6._12_4_ = 0x7fffffff;
          auVar22 = vandps_avx512vl(ZEXT416((uint)(fVar42 + -1.0)),auVar6);
          uVar4 = vcmpss_avx512f(auVar22,ZEXT416(0x358637bd),0xe);
          bVar16 = (bool)((byte)uVar4 & 1);
          auVar33._0_4_ =
               powf((float)((uint)bVar16 * (int)((fVar17 - fVar42) / (1.0 - fVar42)) +
                           (uint)!bVar16 * (int)fVar17),power);
          auVar33._4_60_ = extraout_var_01;
          auVar20 = auVar33._0_16_;
          uVar4 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar25,2);
          auVar21._8_8_ = in_register_00001208._0_8_;
          auVar21._0_8_ = (ulong)((byte)uVar4 & 1) * (long)v_min;
          dVar39 = v_max;
        }
        else {
          auVar32._0_4_ = powf(1.0 - fVar17 / fVar42,power);
          auVar32._4_60_ = extraout_var_00;
          auVar20 = auVar32._0_16_;
          auVar21 = vminsd_avx(auVar22,ZEXT816(0) << 0x40);
          dVar39 = v_min;
        }
        auVar28._0_8_ = (double)auVar20._0_4_;
        auVar28._8_8_ = auVar20._8_8_;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = dVar39 - auVar21._0_8_;
        auVar25 = vfmadd213sd_fma(auVar28,auVar40,auVar21);
        dVar39 = auVar25._0_8_;
      }
      else {
        auVar22._0_8_ = (double)fVar17;
        auVar22._8_8_ = auVar27._8_8_;
        if (uVar12 == 8) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = dVar39;
          auVar25 = vfmadd132sd_fma(auVar22,auVar25,auVar1);
          dVar39 = auVar25._0_8_;
        }
        else {
          auVar25._8_8_ = 0;
          auVar25._0_8_ = auVar22._0_8_ * dVar39;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = auVar22._0_8_ * dVar39 + 0.5;
          auVar25 = vmaxsd_avx(auVar41,auVar25);
          dVar39 = auVar25._0_8_ + v_min;
        }
      }
      auVar34._0_8_ = RoundScalarWithFormatT<double,double>(format,data_type,dVar39);
      auVar34._8_56_ = extraout_var_03;
      dVar39 = *v;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar39;
      if ((dVar39 != auVar34._0_8_) || (NAN(dVar39) || NAN(auVar34._0_8_))) {
        *v = auVar34._0_8_;
        bVar16 = true;
      }
      else {
        uVar4 = vcmpsd_avx512f(auVar34._0_16_,auVar35,4);
        bVar16 = (bool)((byte)uVar4 & 1);
      }
    }
    else {
      bVar16 = false;
    }
  }
  else {
    bVar16 = false;
  }
  if (1.0 <= fVar3) {
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar22 = vxorps_avx512vl(auVar19,auVar5);
    auVar25 = vfnmadd231ss_fma(ZEXT416((uint)(fVar23 + -2.0)),auVar19,SUB6416(ZEXT464(0x3f000000),0)
                              );
    fVar23 = SliderCalcRatioFromValueT<double,double>(data_type,*v,v_min,v_max,power,fVar42);
    bVar15 = uVar13 == 0;
    auVar25 = vfmadd213ss_fma(ZEXT416((uint)(auVar25._0_4_ - fVar37)),
                              ZEXT416((uint)bVar15 * (int)fVar23 +
                                      (uint)!bVar15 * (int)(1.0 - fVar23)),ZEXT416((uint)fVar37));
    if (bVar15) {
      auVar22 = vfmadd213ss_fma(auVar22,SUB6416(ZEXT464(0x3f000000),0),auVar25);
      fVar37 = (bb->Min).y;
      fVar23 = (bb->Max).y;
      auVar19 = vfmadd213ss_fma(auVar19,SUB6416(ZEXT464(0x3f000000),0),auVar25);
      (out_grab_bb->Min).x = auVar22._0_4_;
      (out_grab_bb->Min).y = fVar37 + 2.0;
      (out_grab_bb->Max).x = auVar19._0_4_;
      (out_grab_bb->Max).y = fVar23 + -2.0;
    }
    else {
      fVar37 = (bb->Max).x;
      auVar22 = vfmadd213ss_fma(auVar22,SUB6416(ZEXT464(0x3f000000),0),auVar25);
      auVar19 = vfmadd213ss_fma(auVar19,SUB6416(ZEXT464(0x3f000000),0),auVar25);
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = auVar22._0_4_;
      (out_grab_bb->Max).x = fVar37 + -2.0;
      (out_grab_bb->Max).y = auVar19._0_4_;
    }
  }
  else {
    IVar2 = bb->Min;
    out_grab_bb->Min = IVar2;
    out_grab_bb->Max = IVar2;
  }
  return bVar16;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}